

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

boolean encode_mcu_huff(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  undefined4 uVar1;
  uint uVar2;
  jpeg_entropy_encoder *pjVar3;
  jpeg_destination_mgr *pjVar4;
  boolean bVar5;
  int iVar6;
  JOCTET *pJVar7;
  uint uVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  JOCTET *__src;
  working_state state;
  JOCTET local_238 [520];
  
  pjVar3 = cinfo->entropy;
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  state.cur.put_buffer = *(anon_union_8_2_c960f3a9_for_put_buffer *)(pjVar3 + 1);
  state.cur._8_8_ = pjVar3[1].encode_mcu;
  state.cur.last_dc_val._4_8_ = pjVar3[1].finish_pass;
  state.cur._24_8_ = pjVar3[2].start_pass;
  state.cinfo = cinfo;
  iVar6 = *(int *)&pjVar3[8].start_pass;
  state.simd = iVar6;
  if ((cinfo->restart_interval != 0) && (*(int *)&pjVar3[2].encode_mcu == 0)) {
    uVar1 = *(undefined4 *)((long)&pjVar3[2].encode_mcu + 4);
    bVar5 = flush_bits(&state);
    if (bVar5 == 0) {
      return 0;
    }
    pJVar7 = state.next_output_byte + 1;
    *state.next_output_byte = 0xff;
    state.free_in_buffer = state.free_in_buffer - 1;
    state.next_output_byte = pJVar7;
    if ((state.free_in_buffer == 0) && (bVar5 = dump_buffer(&state), bVar5 == 0)) {
      return 0;
    }
    pJVar7 = state.next_output_byte + 1;
    *state.next_output_byte = (char)uVar1 + 0xd0;
    state.free_in_buffer = state.free_in_buffer - 1;
    state.next_output_byte = pJVar7;
    if ((state.free_in_buffer == 0) && (bVar5 = dump_buffer(&state), bVar5 == 0)) {
      return 0;
    }
    iVar6 = (state.cinfo)->comps_in_scan;
    for (lVar9 = 0; lVar9 < iVar6; lVar9 = lVar9 + 1) {
      state.cur.last_dc_val[lVar9] = 0;
    }
    iVar6 = *(int *)&pjVar3[8].start_pass;
  }
  lVar9 = 0;
  if (iVar6 == 0) {
    for (; lVar9 < cinfo->blocks_in_MCU; lVar9 = lVar9 + 1) {
      iVar6 = cinfo->MCU_membership[lVar9];
      bVar5 = encode_one_block(&state,*MCU_data[lVar9],state.cur.last_dc_val[iVar6],
                               (c_derived_tbl *)
                               (&pjVar3[2].finish_pass)[cinfo->cur_comp_info[iVar6]->dc_tbl_no],
                               (c_derived_tbl *)
                               (&pjVar3[4].start_pass)[cinfo->cur_comp_info[iVar6]->ac_tbl_no]);
      if (bVar5 == 0) {
        return 0;
      }
      state.cur.last_dc_val[iVar6] = (int)(*MCU_data[lVar9])[0];
    }
  }
  else {
    for (; sVar10 = state.free_in_buffer, lVar9 < cinfo->blocks_in_MCU; lVar9 = lVar9 + 1) {
      pJVar7 = local_238;
      if (0x1ff < state.free_in_buffer) {
        pJVar7 = state.next_output_byte;
      }
      iVar6 = cinfo->MCU_membership[lVar9];
      pJVar7 = jsimd_huff_encode_one_block
                         (&state,pJVar7,*MCU_data[lVar9],state.cur.last_dc_val[iVar6],
                          (c_derived_tbl *)
                          (&pjVar3[2].finish_pass)[cinfo->cur_comp_info[iVar6]->dc_tbl_no],
                          (c_derived_tbl *)
                          (&pjVar3[4].start_pass)[cinfo->cur_comp_info[iVar6]->ac_tbl_no]);
      if (sVar10 < 0x200) {
        __src = local_238;
        for (uVar11 = (long)pJVar7 - (long)__src; uVar11 != 0; uVar11 = uVar11 - sVar10) {
          sVar10 = state.free_in_buffer;
          if (uVar11 < state.free_in_buffer) {
            sVar10 = uVar11;
          }
          memcpy(state.next_output_byte,__src,sVar10);
          state.next_output_byte = state.next_output_byte + sVar10;
          state.free_in_buffer = state.free_in_buffer - sVar10;
          if ((state.free_in_buffer == 0) && (bVar5 = dump_buffer(&state), bVar5 == 0)) {
            return 0;
          }
          __src = __src + sVar10;
        }
      }
      else {
        state.free_in_buffer =
             (size_t)(state.next_output_byte + (state.free_in_buffer - (long)pJVar7));
        state.next_output_byte = pJVar7;
      }
      state.cur.last_dc_val[iVar6] = (int)(*MCU_data[lVar9])[0];
    }
  }
  pjVar4 = cinfo->dest;
  pjVar4->next_output_byte = state.next_output_byte;
  pjVar4->free_in_buffer = state.free_in_buffer;
  pjVar3[1].finish_pass = (_func_void_j_compress_ptr *)state.cur.last_dc_val._4_8_;
  pjVar3[2].start_pass = (_func_void_j_compress_ptr_boolean *)state.cur._24_8_;
  *(anon_union_8_2_c960f3a9_for_put_buffer *)(pjVar3 + 1) = state.cur.put_buffer;
  pjVar3[1].encode_mcu = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)state.cur._8_8_;
  uVar2 = cinfo->restart_interval;
  if (uVar2 != 0) {
    uVar8 = *(uint *)&pjVar3[2].encode_mcu;
    if (*(uint *)&pjVar3[2].encode_mcu == 0) {
      *(uint *)((long)&pjVar3[2].encode_mcu + 4) =
           *(int *)((long)&pjVar3[2].encode_mcu + 4) + 1U & 7;
      uVar8 = uVar2;
    }
    *(uint *)&pjVar3[2].encode_mcu = uVar8 - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_huff(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  working_state state;
  int blkn, ci;
  jpeg_component_info *compptr;

  /* Load up working state */
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  state.cur = entropy->saved;
  state.cinfo = cinfo;
  state.simd = entropy->simd;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!emit_restart(&state, entropy->next_restart_num))
        return FALSE;
  }

  /* Encode the MCU data blocks */
  if (entropy->simd) {
    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      if (!encode_one_block_simd(&state,
                                 MCU_data[blkn][0], state.cur.last_dc_val[ci],
                                 entropy->dc_derived_tbls[compptr->dc_tbl_no],
                                 entropy->ac_derived_tbls[compptr->ac_tbl_no]))
        return FALSE;
      /* Update last_dc_val */
      state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
    }
  } else {
    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      if (!encode_one_block(&state,
                            MCU_data[blkn][0], state.cur.last_dc_val[ci],
                            entropy->dc_derived_tbls[compptr->dc_tbl_no],
                            entropy->ac_derived_tbls[compptr->ac_tbl_no]))
        return FALSE;
      /* Update last_dc_val */
      state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
    }
  }

  /* Completed MCU, so update state */
  cinfo->dest->next_output_byte = state.next_output_byte;
  cinfo->dest->free_in_buffer = state.free_in_buffer;
  entropy->saved = state.cur;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}